

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O3

bool __thiscall LEFReader::parseSize(LEFReader *this)

{
  string *tokstr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider __nptr;
  _Alloc_hider _Var2;
  token_t tVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  bool bVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__endptr;
  string xnum;
  string ynum;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  int local_7c;
  string local_78;
  double local_58;
  string local_50;
  
  __endptr = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)__endptr;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  tVar3 = tokenize(this,&local_78);
  this->m_curtok = tVar3;
  if (tVar3 == TOK_NUMBER) {
    tokstr = &this->m_tokstr;
    tVar3 = tokenize(this,tokstr);
    this->m_curtok = tVar3;
    if (tVar3 != TOK_IDENT) {
      iVar4 = std::__cxx11::string::compare((char *)tokstr);
      if (iVar4 != 0) {
        local_a0._M_allocated_capacity = (size_type)&local_90;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Expected \'BY\'\n","");
        error(this,(string *)&local_a0);
        goto LAB_0012cab5;
      }
    }
    tVar3 = tokenize(this,&local_50);
    this->m_curtok = tVar3;
    if (tVar3 == TOK_NUMBER) {
      tVar3 = tokenize(this,tokstr);
      __nptr._M_p = local_78._M_dataplus._M_p;
      this->m_curtok = tVar3;
      if (tVar3 == TOK_SEMICOL) {
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)__errno_location();
        local_7c = *(int *)paVar5;
        *(undefined4 *)paVar5 = 0;
        __endptr = &local_a0;
        local_58 = strtod(__nptr._M_p,(char **)&__endptr->_M_allocated_capacity);
        _Var2._M_p = local_50._M_dataplus._M_p;
        if ((pointer)local_a0._M_allocated_capacity == __nptr._M_p) {
          std::__throw_invalid_argument("stod");
          goto LAB_0012cb7c;
        }
        iVar4 = *(int *)paVar5;
        if (iVar4 == 0) {
          *(int *)paVar5 = local_7c;
          iVar4 = local_7c;
        }
        else if (iVar4 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012ca57;
        }
        *(undefined4 *)paVar5 = 0;
        strtod(local_50._M_dataplus._M_p,(char **)&local_a0._M_allocated_capacity);
        if ((pointer)local_a0._M_allocated_capacity == _Var2._M_p) {
LAB_0012cb7c:
          uVar6 = std::__throw_invalid_argument("stod");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_allocated_capacity != paVar5) {
            operator_delete((void *)local_a0._M_allocated_capacity,
                            local_90._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,
                            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                     local_50.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                     local_78.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar6);
        }
        __endptr = &local_78.field_2;
        if (*(int *)paVar5 == 0) {
LAB_0012cb56:
          *(int *)paVar5 = iVar4;
        }
        else if (*(int *)paVar5 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012cb56;
        }
        bVar7 = true;
        (*this->_vptr_LEFReader[6])(local_58,this);
        goto LAB_0012cace;
      }
      local_a0._M_allocated_capacity = (size_type)&local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Expected a semicolon\n","");
      error(this,(string *)&local_a0);
    }
    else {
LAB_0012ca57:
      local_a0._M_allocated_capacity = (size_type)&local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Expected a number\n","");
      error(this,(string *)&local_a0);
    }
  }
  else {
    local_a0._M_allocated_capacity = (size_type)&local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Expected a number\n","");
    error(this,(string *)&local_a0);
  }
LAB_0012cab5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_allocated_capacity != &local_90) {
    operator_delete((void *)local_a0._M_allocated_capacity,local_90._M_allocated_capacity + 1);
  }
  bVar7 = false;
LAB_0012cace:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != __endptr) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool LEFReader::parseSize()
{
    // SIZE <number> BY <number> ';' 

    
    std::string xnum;
    std::string ynum;

    m_curtok = tokenize(xnum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(m_tokstr);
    if ((m_curtok != TOK_IDENT) && (m_tokstr != "BY"))
    {
        error("Expected 'BY'\n");
        return false;
    }

    m_curtok = tokenize(ynum);
    if (m_curtok != TOK_NUMBER)
    {
        error("Expected a number\n");
        return false;
    }

    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon\n");
        return false;
    }

    double xnumd, ynumd;
    try
    {
        xnumd = std::stod(xnum);
        ynumd = std::stod(ynum);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onSize(xnumd, ynumd);

    //std::cout << "  SIZE " << xnum << " " << ynum << "\n";

    return true;
}